

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O0

void __thiscall hwnet::TCPSocket::Shutdown(TCPSocket *this)

{
  bool bVar1;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> guard;
  TCPSocket *this_local;
  
  guard._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->mtx);
  bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->closed);
  if ((!bVar1) && ((this->shutdown & 1U) == 0)) {
    this->shutdown = true;
    bVar1 = linklist::empty(this->ptrSendlist);
    if (bVar1) {
      shutdown(this->fd,1);
    }
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return;
}

Assistant:

void TCPSocket::Shutdown() {

	std::lock_guard<std::mutex> guard(this->mtx);
	if(this->closed || this->shutdown) {
		return;
	}

	this->shutdown = true;

	if(this->ptrSendlist->empty()){
		::shutdown(this->fd,SHUT_WR);
	}
}